

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_std::uint64_t>
* __thiscall
pstore::http::details::
read_payload_length<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_std::uint64_t>
           *__return_storage_ptr__,details *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,uint base_length)

{
  error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>
  local_40;
  uint local_24;
  details *pdStack_20;
  uint base_length_local;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *reader_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  local_24 = (uint)io._M_data;
  pdStack_20 = this;
  reader_local = reader;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  if (local_24 < 0x7e) {
    error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
    ::
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>&,unsigned_int&>
              ((error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
                *)__return_storage_ptr__,&reader_local,&local_24);
  }
  else if (local_24 == 0x7e) {
    read_and_byte_swap<unsigned_short,pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_40,this,reader,io);
    error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
    ::
    error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short>,void>
              ((error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_long>>
                *)__return_storage_ptr__,&local_40);
    error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>_>
    ::~error_or(&local_40);
  }
  else {
    read_and_byte_swap<unsigned_long,pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (__return_storage_ptr__,this,reader,io);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or_n<IO, std::uint64_t> read_payload_length (Reader & reader, IO io,
                                                               unsigned base_length) {
                if (base_length < 126U) {
                    // "If 0-125, that is the payload length."
                    return error_or_n<IO, std::uint64_t>{in_place, io, base_length};
                }
                if (base_length == 126U) {
                    // "If 126, the following 2 bytes interpreted as a 16-bit unsigned integer are
                    // the payload length."
                    return read_and_byte_swap<std::uint16_t> (reader, io);
                }
                // "If 127, the following 8 bytes interpreted as a 64-bit unsigned integer (the most
                // significant bit MUST be 0) are the payload length. Multibyte length quantities
                // are expressed in network byte order."
                return read_and_byte_swap<std::uint64_t> (reader, io);
            }